

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

bool __thiscall Catch::TestSpec::TagPattern::matches(TagPattern *this,TestCaseInfo *testCase)

{
  __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_> _Var1
  ;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<Catch::Tag_const*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>,__gnu_cxx::__ops::_Iter_equals_val<Catch::Tag_const>>
                    ((testCase->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (testCase->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  return _Var1._M_current !=
         (testCase->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
         super__Vector_impl_data._M_finish;
}

Assistant:

bool TestSpec::TagPattern::matches( TestCaseInfo const& testCase ) const {
        return std::find( begin( testCase.tags ),
                          end( testCase.tags ),
                          Tag( m_tag ) ) != end( testCase.tags );
    }